

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

void * __thiscall
v_hashmap<unsigned_long,_features>::iterator(v_hashmap<unsigned_long,_features> *this)

{
  hash_elem *phVar1;
  
  phVar1 = (this->dat)._begin;
  while( true ) {
    if (phVar1 == (this->dat).end_array) {
      return (void *)0x0;
    }
    if (phVar1->occupied != false) break;
    phVar1 = phVar1 + 1;
  }
  return phVar1;
}

Assistant:

void* iterator()
  {
    hash_elem* e = dat.begin();
    while (e != dat.end_array)
    {
      if (e->occupied)
        return e;
      e++;
    }
    return nullptr;
  }